

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmReg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0)

{
  Data *this_00;
  bool bVar1;
  undefined2 local_1a [4];
  OpLayoutT_AsmReg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  bVar1 = DAT_015b5fbd == '\0';
  if (bVar1) {
    local_1a[0] = (undefined2)R0;
  }
  if (bVar1 && R0 < 0x10000) {
    this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>(this_00,op,&this->super_ByteCodeWriter,false);
    ByteCodeWriter::Data::Write(this_00,local_1a,2);
  }
  return bVar1 && R0 < 0x10000;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmReg1(OpCodeAsmJs op, RegSlot R0)
    {
        OpLayoutT_AsmReg1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }